

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::genDataHandler(CppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  size_t sVar5;
  TDNode *pTVar6;
  ulong *puVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  long *plVar10;
  undefined8 uVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string header;
  ofstream ofs;
  string local_430;
  string local_410;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0;
  long lStack_3b8;
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0;
  undefined8 uStack_398;
  ulong *local_390;
  long local_388;
  ulong local_380;
  long lStack_378;
  ulong *local_370;
  long local_368;
  ulong local_360;
  undefined8 uStack_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_3b0 = &local_3a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"#ifndef INCLUDE_DATAHANDLER_HPP_\n","");
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3b0);
  puVar7 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar7) {
    local_380 = *puVar7;
    lStack_378 = plVar2[3];
    local_390 = &local_380;
  }
  else {
    local_380 = *puVar7;
    local_390 = (ulong *)*plVar2;
  }
  local_388 = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_390);
  puVar7 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar7) {
    local_360 = *puVar7;
    uStack_358 = puVar3[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar7;
    local_370 = (ulong *)*puVar3;
  }
  local_368 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
  puVar8 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar8) {
    local_320 = *puVar8;
    uStack_318 = puVar3[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar8;
    local_330 = (undefined8 *)*puVar3;
  }
  local_328 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_330);
  puVar7 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar7) {
    local_3c0 = *puVar7;
    lStack_3b8 = plVar2[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar7;
    local_3d0 = (ulong *)*plVar2;
  }
  local_3c8 = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d0);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_3e0 = *plVar2;
    lStack_3d8 = puVar3[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar2;
    local_3f0 = (long *)*puVar3;
  }
  local_3e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar7 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_410.field_2._M_allocated_capacity = *puVar7;
    local_410.field_2._8_8_ = plVar2[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar7;
    local_410._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_410._M_string_length = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_410);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar9 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430.field_2._8_8_ = plVar2[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_430._M_string_length = plVar2[1];
  *plVar2 = (long)psVar9;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_430);
  plVar10 = plVar2 + 2;
  if ((long *)*plVar2 == plVar10) {
    local_220 = *plVar10;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar10;
    local_230 = (long *)*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)plVar10;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_310 = &local_300;
  plVar10 = plVar2 + 2;
  if ((long *)*plVar2 == plVar10) {
    local_300 = *plVar10;
    lStack_2f8 = plVar2[3];
  }
  else {
    local_300 = *plVar10;
    local_310 = (long *)*plVar2;
  }
  local_308 = plVar2[1];
  *plVar2 = (long)plVar10;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (multifaq::cppgen::MICRO_BENCH != '\x01') goto LAB_001f18cf;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,'\x03');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2af800);
  local_2f0 = &local_2e0;
  puVar7 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar7) {
    local_2e0 = *puVar7;
    lStack_2d8 = plVar2[3];
  }
  else {
    local_2e0 = *puVar7;
    local_2f0 = (ulong *)*plVar2;
  }
  local_2e8 = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_350 = &local_340;
  puVar7 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar7) {
    local_340 = *puVar7;
    lStack_338 = plVar2[3];
  }
  else {
    local_340 = *puVar7;
    local_350 = (ulong *)*plVar2;
  }
  local_348 = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x03');
  uVar12 = 0xf;
  if (local_350 != &local_340) {
    uVar12 = local_340;
  }
  if (uVar12 < (ulong)(local_2c8 + local_348)) {
    uVar12 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar12 = local_2c0[0];
    }
    if (uVar12 < (ulong)(local_2c8 + local_348)) goto LAB_001f0bcb;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_001f0bcb:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2d0);
  }
  puVar7 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar7) {
    local_3a0 = *puVar7;
    uStack_398 = puVar3[3];
    local_3b0 = &local_3a0;
  }
  else {
    local_3a0 = *puVar7;
    local_3b0 = (ulong *)*puVar3;
  }
  local_3a8 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3b0);
  local_390 = &local_380;
  puVar7 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar7) {
    local_380 = *puVar7;
    lStack_378 = puVar3[3];
  }
  else {
    local_380 = *puVar7;
    local_390 = (ulong *)*puVar3;
  }
  local_388 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,'\x03');
  uVar12 = 0xf;
  if (local_390 != &local_380) {
    uVar12 = local_380;
  }
  if (uVar12 < (ulong)(local_268 + local_388)) {
    uVar12 = 0xf;
    if (local_270 != local_260) {
      uVar12 = local_260[0];
    }
    if (uVar12 < (ulong)(local_268 + local_388)) goto LAB_001f0d21;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_390);
  }
  else {
LAB_001f0d21:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_270);
  }
  puVar7 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar7) {
    local_360 = *puVar7;
    uStack_358 = puVar3[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar7;
    local_370 = (ulong *)*puVar3;
  }
  local_368 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
  puVar8 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar8) {
    local_320 = *puVar8;
    uStack_318 = puVar3[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar8;
    local_330 = (undefined8 *)*puVar3;
  }
  local_328 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
  puVar7 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar7) {
    local_3c0 = *puVar7;
    lStack_3b8 = puVar3[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar7;
    local_3d0 = (ulong *)*puVar3;
  }
  local_3c8 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,'\x03');
  uVar12 = 0xf;
  if (local_3d0 != &local_3c0) {
    uVar12 = local_3c0;
  }
  if (uVar12 < (ulong)(local_288 + local_3c8)) {
    uVar12 = 0xf;
    if (local_290 != local_280) {
      uVar12 = local_280[0];
    }
    if (uVar12 < (ulong)(local_288 + local_3c8)) goto LAB_001f0eb2;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_3d0);
  }
  else {
LAB_001f0eb2:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_290);
  }
  local_3f0 = &local_3e0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_3e0 = *plVar2;
    lStack_3d8 = puVar3[3];
  }
  else {
    local_3e0 = *plVar2;
    local_3f0 = (long *)*puVar3;
  }
  local_3e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar7 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_410.field_2._M_allocated_capacity = *puVar7;
    local_410.field_2._8_8_ = plVar2[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar7;
    local_410._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_410._M_string_length = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x03');
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    uVar11 = local_410.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_2a8 + local_410._M_string_length) {
    uVar12 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar12 = local_2a0[0];
    }
    if (uVar12 < local_2a8 + local_410._M_string_length) goto LAB_001f0fdf;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_410._M_dataplus._M_p);
  }
  else {
LAB_001f0fdf:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_2b0);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar9 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430.field_2._8_8_ = puVar3[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_430._M_string_length = puVar3[1];
  *puVar3 = psVar9;
  puVar3[1] = 0;
  *(undefined1 *)psVar9 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_220 = *plVar2;
    lStack_218 = puVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar2;
    local_230 = (long *)*puVar3;
  }
  local_228 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"#define BEGIN_MICRO_BENCH(timer) begin_##timer = ","");
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_220 = *plVar2;
    lStack_218 = puVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar2;
    local_230 = (long *)*puVar3;
  }
  local_228 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_390 = &local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"#define END_MICRO_BENCH(timer) finish_##timer = ","");
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_390);
  puVar7 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar7) {
    local_360 = *puVar7;
    uStack_358 = puVar3[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar7;
    local_370 = (ulong *)*puVar3;
  }
  local_368 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_3b0 = &local_3a0;
  std::__cxx11::string::_M_construct((ulong)&local_3b0,'\x03');
  uVar12 = 0xf;
  if (local_370 != &local_360) {
    uVar12 = local_360;
  }
  if (uVar12 < (ulong)(local_3a8 + local_368)) {
    uVar12 = 0xf;
    if (local_3b0 != &local_3a0) {
      uVar12 = local_3a0;
    }
    if (uVar12 < (ulong)(local_3a8 + local_368)) goto LAB_001f13e4;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_370);
  }
  else {
LAB_001f13e4:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_3b0);
  }
  puVar8 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar8) {
    local_320 = *puVar8;
    uStack_318 = puVar3[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar8;
    local_330 = (undefined8 *)*puVar3;
  }
  local_328 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
  puVar7 = puVar3 + 2;
  local_350 = &local_340;
  if ((ulong *)*puVar3 == puVar7) {
    local_3c0 = *puVar7;
    lStack_3b8 = puVar3[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar7;
    local_3d0 = (ulong *)*puVar3;
  }
  local_3c8 = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x03');
  uVar12 = 0xf;
  if (local_3d0 != &local_3c0) {
    uVar12 = local_3c0;
  }
  if (uVar12 < (ulong)(local_348 + local_3c8)) {
    uVar12 = 0xf;
    if (local_350 != &local_340) {
      uVar12 = local_340;
    }
    if (uVar12 < (ulong)(local_348 + local_3c8)) goto LAB_001f151d;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_3d0);
  }
  else {
LAB_001f151d:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_350);
  }
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_3e0 = *plVar2;
    lStack_3d8 = puVar3[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar2;
    local_3f0 = (long *)*puVar3;
  }
  local_3e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  puVar7 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_410.field_2._M_allocated_capacity = *puVar7;
    local_410.field_2._8_8_ = puVar3[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *puVar7;
    local_410._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_410._M_string_length = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,'\x03');
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    uVar11 = local_410.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_2e8 + local_410._M_string_length) {
    uVar12 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar12 = local_2e0;
    }
    if (uVar12 < local_2e8 + local_410._M_string_length) goto LAB_001f164d;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_410._M_dataplus._M_p);
  }
  else {
LAB_001f164d:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_2f0);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar9 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430.field_2._8_8_ = puVar3[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_430._M_string_length = puVar3[1];
  *puVar3 = psVar9;
  puVar3[1] = 0;
  *(undefined1 *)psVar9 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_220 = *plVar2;
    lStack_218 = puVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar2;
    local_230 = (long *)*puVar3;
  }
  local_228 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"#define PRINT_MICRO_BENCH(timer) std::cout << ","");
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_220 = *plVar2;
    lStack_218 = puVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar2;
    local_230 = (long *)*puVar3;
  }
  local_228 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
LAB_001f18cf:
  local_3d0 = &local_3c0;
  std::__cxx11::string::_M_construct((ulong)&local_3d0,'\x03');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x2afa95);
  plVar10 = plVar2 + 2;
  if ((long *)*plVar2 == plVar10) {
    local_3e0 = *plVar10;
    lStack_3d8 = plVar2[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar10;
    local_3f0 = (long *)*plVar2;
  }
  paVar1 = &local_430.field_2;
  local_3e8 = plVar2[1];
  *plVar2 = (long)plVar10;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  psVar9 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_410.field_2._M_allocated_capacity = *psVar9;
    local_410.field_2._8_8_ = plVar2[3];
  }
  else {
    local_410.field_2._M_allocated_capacity = *psVar9;
    local_410._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_410._M_string_length = plVar2[1];
  *plVar2 = (long)psVar9;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_410,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  psVar9 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430.field_2._8_8_ = plVar2[3];
    local_430._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar9;
    local_430._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_430._M_string_length = plVar2[1];
  *plVar2 = (long)psVar9;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_220 = *plVar2;
    lStack_218 = puVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar2;
    local_230 = (long *)*puVar3;
  }
  local_228 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_430);
  std::ofstream::ofstream(&local_230,(string *)&local_430,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)local_310,local_308);
  genTupleStructs_abi_cxx11_(&local_430,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_430._M_dataplus._M_p,local_430._M_string_length);
  genCaseIdentifiers_abi_cxx11_(&local_410,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_410._M_dataplus._M_p,local_410._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  uVar12 = 0;
  while( true ) {
    sVar5 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar5 <= uVar12) break;
    local_3d0 = &local_3c0;
    std::__cxx11::string::_M_construct((ulong)&local_3d0,'\x03');
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d0);
    local_3f0 = &local_3e0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_3e0 = *plVar2;
      lStack_3d8 = puVar3[3];
    }
    else {
      local_3e0 = *plVar2;
      local_3f0 = (long *)*puVar3;
    }
    local_3e8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    pTVar6 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar12);
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_3f0,(ulong)(pTVar6->_name)._M_dataplus._M_p);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    psVar9 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_410.field_2._M_allocated_capacity = *psVar9;
      local_410.field_2._8_8_ = puVar3[3];
    }
    else {
      local_410.field_2._M_allocated_capacity = *psVar9;
      local_410._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_410._M_string_length = puVar3[1];
    *puVar3 = psVar9;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_410);
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    psVar9 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_430.field_2._M_allocated_capacity = *psVar9;
      local_430.field_2._8_8_ = puVar3[3];
    }
    else {
      local_430.field_2._M_allocated_capacity = *psVar9;
      local_430._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_430._M_string_length = puVar3[1];
    *puVar3 = psVar9;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,local_430._M_dataplus._M_p,local_430._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0);
    }
    uVar12 = uVar12 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n",0x28);
  paVar1 = &local_430.field_2;
  std::ofstream::close();
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_430);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  genTupleStructConstructors_abi_cxx11_(&local_430,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_430._M_dataplus._M_p,local_430._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = _error_with_option_name;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  return;
}

Assistant:

void CppGenerator::genDataHandler()
{
    std::string header = std::string("#ifndef INCLUDE_DATAHANDLER_HPP_\n")+
        "#define INCLUDE_DATAHANDLER_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    header += "#include <parallel/algorithm>\n";
#endif

    if (MICRO_BENCH)
    {
        header += "#define INIT_MICRO_BENCH(timer)\\\n"+offset(1)+
            "auto begin_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+
            "auto finish_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"std::chrono::duration<double>  elapsed_##timer = "+
            "finish_##timer - begin_##timer;\\\n"+
            offset(1)+"double time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"double global_time_##timer = 0;\n";

        header += std::string("#define BEGIN_MICRO_BENCH(timer) begin_##timer = ")+
            "std::chrono::high_resolution_clock::now();\n";
        header += std::string("#define END_MICRO_BENCH(timer) finish_##timer = ")+
            "std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"elapsed_##timer = finish_##timer - begin_##timer;\\\n"+
            offset(1)+"time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"global_time_##timer += time_spent_##timer;\n";

        header += std::string("#define PRINT_MICRO_BENCH(timer) std::cout << ")+
            "#timer << \": \" << std::to_string(global_time_##timer) << std::endl;\n\n";
    }
    
    header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"const std::string PATH_TO_DATA = \""+PATH_TO_DATA+"\";\n\n";

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.h", std::ofstream::out);

    ofs << header << genTupleStructs() << genCaseIdentifiers() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << offset(1)+"extern void sort"+_td->getRelation(relID)->_name+"();\n";
    
    ofs <<  "}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.cpp", std::ofstream::out);
    ofs << genTupleStructConstructors() << std::endl;
    ofs.close();
}